

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O2

int32_t __thiscall icu_63::IslamicCalendar::yearStart(IslamicCalendar *this,int32_t year)

{
  int32_t iVar1;
  
  switch(*(undefined4 *)&(this->super_Calendar).field_0x264) {
  case 0:
    iVar1 = trueMonthStart(this,year * 0xc + -0xc);
    return iVar1;
  case 1:
  case 3:
    goto switchD_001f10c4_caseD_1;
  case 2:
    if (0xfffffed2 < year - 0x641U) goto switchD_001f10c4_default;
switchD_001f10c4_caseD_1:
    iVar1 = ClockMath::floorDivide(year * 0xb + 3,0x1e);
    return iVar1 + year * 0x162 + -0x162;
  default:
switchD_001f10c4_default:
    return (int)(char)UMALQURA_MONTHLENGTH[(long)year + 0x11c] +
           (int)((double)(year + -0x514) * 354.3672 + 460322.05 + 0.5);
  }
}

Assistant:

int32_t IslamicCalendar::yearStart(int32_t year) const{
    if (cType == CIVIL || cType == TBLA ||
        (cType == UMALQURA && (year < UMALQURA_YEAR_START || year > UMALQURA_YEAR_END))) 
    {
        return (year-1)*354 + ClockMath::floorDivide((3+11*year),30);
    } else if(cType==ASTRONOMICAL){
        return trueMonthStart(12*(year-1));
    } else {
        year -= UMALQURA_YEAR_START;
        // rounded least-squares fit of the dates previously calculated from UMALQURA_MONTHLENGTH iteration
        int32_t yrStartLinearEstimate = (int32_t)((354.36720 * (double)year) + 460322.05 + 0.5);
        // need a slight correction to some
        return yrStartLinearEstimate + umAlQuraYrStartEstimateFix[year];
    }
}